

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypeTree.cpp
# Opt level: O1

InplaceStr GetMemberSetTypeName(ExpressionContext *ctx,TypeBase *type)

{
  char *__src;
  int iVar1;
  undefined4 extraout_var;
  size_t sVar2;
  uint uVar3;
  InplaceStr IVar4;
  
  uVar3 = (*(int *)&(type->name).end - *(int *)&(type->name).begin) + 9;
  iVar1 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,(ulong)uVar3);
  IVar4.begin = (char *)CONCAT44(extraout_var,iVar1);
  __src = (type->name).begin;
  memcpy(IVar4.begin,__src,(ulong)(uint)(*(int *)&(type->name).end - (int)__src));
  builtin_strncpy(IVar4.begin + (uint)(*(int *)&(type->name).end - *(int *)&(type->name).begin),
                  " members",9);
  sVar2 = strlen(IVar4.begin);
  if (sVar2 + 1 == (ulong)uVar3) {
    IVar4.end = IVar4.begin + sVar2;
    return IVar4;
  }
  __assert_fail("strlen(name) + 1 == nameLength",
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/TypeTree.cpp"
                ,0x15b,"InplaceStr GetMemberSetTypeName(ExpressionContext &, TypeBase *)");
}

Assistant:

InplaceStr GetMemberSetTypeName(ExpressionContext &ctx, TypeBase* type)
{
	unsigned nameLength = type->name.length() + unsigned(strlen(" members")) + 1;
	char *name = (char*)ctx.allocator->alloc(nameLength);

	char *pos = name;

	memcpy(pos, type->name.begin, type->name.length());
	pos += type->name.length();

	strcpy(pos, " members");
	pos += strlen(" members");

	*pos++ = 0;

	assert(strlen(name) + 1 == nameLength);
	return InplaceStr(name);
}